

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall testing::Test::Run(Test *this)

{
  bool bVar1;
  UnitTestImpl *this_00;
  OsStackTraceGetterInterface *pOVar2;
  
  bVar1 = HasSameFixtureClass();
  if (bVar1) {
    this_00 = internal::GetUnitTestImpl();
    pOVar2 = internal::UnitTestImpl::os_stack_trace_getter(this_00);
    (*pOVar2->_vptr_OsStackTraceGetterInterface[3])(pOVar2);
    internal::HandleExceptionsInMethodIfSupported<testing::Test,void>(this,0x11,(char *)0x0);
    bVar1 = HasFatalFailure();
    if (!bVar1) {
      bVar1 = IsSkipped();
      if (!bVar1) {
        pOVar2 = internal::UnitTestImpl::os_stack_trace_getter(this_00);
        (*pOVar2->_vptr_OsStackTraceGetterInterface[3])(pOVar2);
        internal::HandleExceptionsInMethodIfSupported<testing::Test,void>(this,0x21,(char *)0x0);
      }
    }
    pOVar2 = internal::UnitTestImpl::os_stack_trace_getter(this_00);
    (*pOVar2->_vptr_OsStackTraceGetterInterface[3])(pOVar2);
    internal::HandleExceptionsInMethodIfSupported<testing::Test,void>(this,0x19,(char *)0x0);
    return;
  }
  return;
}

Assistant:

void Test::Run() {
  if (!HasSameFixtureClass()) return;

  internal::UnitTestImpl* const impl = internal::GetUnitTestImpl();
  impl->os_stack_trace_getter()->UponLeavingGTest();
  internal::HandleExceptionsInMethodIfSupported(this, &Test::SetUp, "SetUp()");
  // We will run the test only if SetUp() was successful and didn't call
  // GTEST_SKIP().
  if (!HasFatalFailure() && !IsSkipped()) {
    impl->os_stack_trace_getter()->UponLeavingGTest();
    internal::HandleExceptionsInMethodIfSupported(
        this, &Test::TestBody, "the test body");
  }

  // However, we want to clean up as much as possible.  Hence we will
  // always call TearDown(), even if SetUp() or the test body has
  // failed.
  impl->os_stack_trace_getter()->UponLeavingGTest();
  internal::HandleExceptionsInMethodIfSupported(
      this, &Test::TearDown, "TearDown()");
}